

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::D3MFImporter::InternReadFile
          (D3MFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  CIrrXML_IOStreamReader *this_00;
  IOStream *_stream;
  pointer callback;
  IrrXMLReader *__p;
  pointer xmlReader_00;
  undefined1 local_e0 [8];
  XmlSerializer xmlSerializer;
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  xmlReader;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  local_40;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  xmlStream;
  D3MFOpcPackage opcPackage;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *filename_local;
  D3MFImporter *this_local;
  
  D3MF::D3MFOpcPackage::D3MFOpcPackage((D3MFOpcPackage *)&xmlStream,pIOHandler,filename);
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  _stream = D3MF::D3MFOpcPackage::RootStream((D3MFOpcPackage *)&xmlStream);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
  unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
            ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
              *)&local_40,this_00);
  callback = std::
             unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
             ::get(&local_40);
  __p = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
  std::
  unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
  ::unique_ptr<std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>,void>
            ((unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
              *)&xmlSerializer.xmlReader,__p);
  xmlReader_00 = std::
                 unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                 ::get((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                        *)&xmlSerializer.xmlReader);
  D3MF::XmlSerializer::XmlSerializer((XmlSerializer *)local_e0,xmlReader_00);
  D3MF::XmlSerializer::ImportXml((XmlSerializer *)local_e0,pScene);
  D3MF::XmlSerializer::~XmlSerializer((XmlSerializer *)local_e0);
  std::
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  ::~unique_ptr((unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
                 *)&xmlSerializer.xmlReader);
  std::
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>::
  ~unique_ptr(&local_40);
  D3MF::D3MFOpcPackage::~D3MFOpcPackage((D3MFOpcPackage *)&xmlStream);
  return;
}

Assistant:

void D3MFImporter::InternReadFile( const std::string &filename, aiScene *pScene, IOSystem *pIOHandler ) {
    D3MF::D3MFOpcPackage opcPackage(pIOHandler, filename);

    std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(opcPackage.RootStream()));
    std::unique_ptr<D3MF::XmlReader> xmlReader(irr::io::createIrrXMLReader(xmlStream.get()));

    D3MF::XmlSerializer xmlSerializer(xmlReader.get());

    xmlSerializer.ImportXml(pScene);
}